

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_schema_factory.hpp
# Opt level: O1

unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::get_factory(validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
             string_view *schema_id,evaluation_options *options,schema_store_type *schema_store_ptr,
             vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
             *resolve_funcs,
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *vocabulary)

{
  pointer pcVar1;
  void *pvVar2;
  undefined8 uVar3;
  int iVar4;
  bool bVar5;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_68;
  _func_int *local_58 [2];
  _Head_base<0UL,_jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  local_48;
  string_view *local_40;
  pointer local_38;
  
  *(undefined8 *)this = 0;
  pcVar1 = (options->default_version_)._M_dataplus._M_p;
  pvVar2 = (void *)(options->default_version_)._M_string_length;
  local_48._M_head_impl =
       (schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *)this;
  local_40 = schema_id;
  local_38 = (pointer)resolve_funcs;
  schema_version::draft202012_abi_cxx11_();
  uVar3 = local_68._0_8_;
  if (pcVar1 == (pointer)local_68.int64_.val_) {
    if (pcVar1 == (pointer)0x0) {
      bVar5 = true;
    }
    else {
      iVar4 = bcmp(pvVar2,(void *)local_68._0_8_,(size_t)pcVar1);
      bVar5 = iVar4 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if ((_func_int **)uVar3 != local_58) {
    operator_delete((void *)uVar3,(ulong)(local_58[0] + 1));
  }
  if (bVar5) {
    std::
    make_unique<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&,std::unordered_map<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>const&>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_68.common_
               ,(validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)local_40,(evaluation_options *)sch,
               (map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                **)schema_store_ptr,
               (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                *)&local_38,vocabulary);
  }
  else {
    pcVar1 = (options->default_version_)._M_dataplus._M_p;
    pvVar2 = (void *)(options->default_version_)._M_string_length;
    schema_version::draft201909_abi_cxx11_();
    uVar3 = local_68._0_8_;
    if (pcVar1 == (pointer)local_68.int64_.val_) {
      if (pcVar1 == (pointer)0x0) {
        bVar5 = true;
      }
      else {
        iVar4 = bcmp(pvVar2,(void *)local_68._0_8_,(size_t)pcVar1);
        bVar5 = iVar4 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if ((_func_int **)uVar3 != local_58) {
      operator_delete((void *)uVar3,(ulong)(local_58[0] + 1));
    }
    if (bVar5) {
      std::
      make_unique<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&,std::unordered_map<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>const&>
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 &local_68.common_,
                 (validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)local_40,(evaluation_options *)sch,
                 (map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                  **)schema_store_ptr,
                 (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                  *)&local_38,vocabulary);
    }
    else {
      pcVar1 = (options->default_version_)._M_dataplus._M_p;
      pvVar2 = (void *)(options->default_version_)._M_string_length;
      schema_version::draft7_abi_cxx11_();
      uVar3 = local_68._0_8_;
      if (pcVar1 == (pointer)local_68.int64_.val_) {
        if (pcVar1 == (pointer)0x0) {
          bVar5 = true;
        }
        else {
          iVar4 = bcmp(pvVar2,(void *)local_68._0_8_,(size_t)pcVar1);
          bVar5 = iVar4 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if ((_func_int **)uVar3 != local_58) {
        operator_delete((void *)uVar3,(ulong)(local_58[0] + 1));
      }
      if (bVar5) {
        std::
        make_unique<jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   &local_68.common_,
                   (validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)local_40,(evaluation_options *)sch,
                   (map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                    **)schema_store_ptr,
                   (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                    *)&local_38);
      }
      else {
        pcVar1 = (options->default_version_)._M_dataplus._M_p;
        pvVar2 = (void *)(options->default_version_)._M_string_length;
        schema_version::draft6_abi_cxx11_();
        uVar3 = local_68._0_8_;
        if (pcVar1 == (pointer)local_68.int64_.val_) {
          if (pcVar1 == (pointer)0x0) {
            bVar5 = true;
          }
          else {
            iVar4 = bcmp(pvVar2,(void *)local_68._0_8_,(size_t)pcVar1);
            bVar5 = iVar4 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if ((_func_int **)uVar3 != local_58) {
          operator_delete((void *)uVar3,(ulong)(local_58[0] + 1));
        }
        if (bVar5) {
          std::
          make_unique<jsoncons::jsonschema::draft6::schema_validator_factory_6<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     &local_68.common_,
                     (validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)local_40,(evaluation_options *)sch,
                     (map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                      **)schema_store_ptr,
                     (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                      *)&local_38);
        }
        else {
          pcVar1 = (options->default_version_)._M_dataplus._M_p;
          pvVar2 = (void *)(options->default_version_)._M_string_length;
          schema_version::draft4_abi_cxx11_();
          uVar3 = local_68._0_8_;
          if (pcVar1 == (pointer)local_68.int64_.val_) {
            if (pcVar1 == (pointer)0x0) {
              bVar5 = true;
            }
            else {
              iVar4 = bcmp(pvVar2,(void *)local_68._0_8_,(size_t)pcVar1);
              bVar5 = iVar4 == 0;
            }
          }
          else {
            bVar5 = false;
          }
          if ((_func_int **)uVar3 != local_58) {
            operator_delete((void *)uVar3,(ulong)(local_58[0] + 1));
          }
          if (bVar5) {
            std::
            make_unique<jsoncons::jsonschema::draft4::schema_validator_factory_4<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       &local_68.common_,
                       (validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        *)local_40,(evaluation_options *)sch,
                       (map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                        **)schema_store_ptr,
                       (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                        *)&local_38);
          }
          else {
            get_factory_from_meta_schema
                      ((validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        *)&local_68.common_,sch,local_40,options,schema_store_ptr,
                       (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                        *)local_38);
          }
        }
      }
    }
  }
  (local_48._M_head_impl)->_vptr_schema_validator_factory_base = (_func_int **)local_68._0_8_;
  return (__uniq_ptr_data<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(tuple<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )local_48._M_head_impl;
}

Assistant:

std::unique_ptr<schema_validator_factory_base<Json>> get_factory(Json&& sch, const jsoncons::string_view& schema_id,
            const evaluation_options& options, schema_store_type* schema_store_ptr,
            const std::vector<resolve_uri_type<Json>>& resolve_funcs,
            const std::unordered_map<std::string,bool>& vocabulary) const
        {
            std::unique_ptr<schema_validator_factory_base<Json>> factory;

            if (schema_id == schema_version::draft202012())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs, vocabulary);
            }
            else if (schema_id == schema_version::draft201909())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs, vocabulary);
            }
            else if (schema_id == schema_version::draft7())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft7::schema_validator_factory_7<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs);
            }
            else if (schema_id == schema_version::draft6())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft6::schema_validator_factory_6<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs);
            }
            else if (schema_id == schema_version::draft4())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft4::schema_validator_factory_4<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs);
            }
            else
            { 
                factory = get_factory_from_meta_schema(std::move(sch), schema_id, options, schema_store_ptr, resolve_funcs);
            }
            return factory;
        }